

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O3

void __thiscall QIODevicePrivate::setWriteChannelCount(QIODevicePrivate *this,int count)

{
  QVarLengthArray<QRingBuffer,_1LL> *array;
  QVLABase<QRingBuffer> *this_00;
  long asize;
  QRingBuffer *pQVar1;
  long sz;
  
  sz = (long)count;
  array = &this->writeBuffers;
  asize = (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  if (asize < sz) {
    if (this->writeBufferChunkSize != 0) {
      this_00 = &(this->writeBuffers).super_QVLABase<QRingBuffer>;
      if ((this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.a < sz) {
        QVLABase<QRingBuffer>::reallocate_impl(this_00,1,array,asize,sz);
        asize = (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
      }
      if (asize < sz) {
        do {
          QVLABase<QRingBuffer>::emplace_back_impl<int&>
                    (this_00,1,array,&this->writeBufferChunkSize);
          asize = (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
        } while (asize < sz);
      }
    }
  }
  else {
    QVLABase<QRingBuffer>::resize_impl(&(this->writeBuffers).super_QVLABase<QRingBuffer>,1,array,sz)
    ;
    asize = (this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  }
  this->writeChannelCount = count;
  pQVar1 = (QRingBuffer *)0x0;
  if (this->currentWriteChannel < asize) {
    pQVar1 = (QRingBuffer *)
             ((long)this->currentWriteChannel * 0x28 +
             (long)(this->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr);
  }
  (this->writeBuffer).m_buf = pQVar1;
  return;
}

Assistant:

void QIODevicePrivate::setWriteChannelCount(int count)
{
    if (count > writeBuffers.size()) {
        // If writeBufferChunkSize is zero (default value), we don't use
        // QIODevice's write buffers.
        if (writeBufferChunkSize != 0) {
            writeBuffers.reserve(count);
            while (writeBuffers.size() < count)
                writeBuffers.emplace_back(writeBufferChunkSize);
        }
    } else {
        writeBuffers.resize(count);
    }
    writeChannelCount = count;
    setCurrentWriteChannel(currentWriteChannel);
}